

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrfd_crowdhuman.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int *piVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  size_t *psVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  size_t sVar22;
  uint uVar23;
  pointer pFVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  int left;
  int top;
  int iVar28;
  ulong uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar38;
  undefined1 auVar35 [16];
  float fVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Mat local_498;
  undefined1 local_448 [32];
  Allocator *local_428;
  int iStack_420;
  int iStack_41c;
  undefined8 uStack_418;
  int local_410;
  size_t local_408;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  undefined1 local_3d8 [32];
  Allocator *local_3b8;
  int iStack_3b0;
  int iStack_3ac;
  undefined8 uStack_3a8;
  int local_3a0;
  size_t local_398;
  Size label_size;
  int *local_380;
  Allocator *local_368;
  vector<float,_std::allocator<float>_> areas;
  Extractor ex;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  Mat local_2b8;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  Mat image;
  undefined4 local_230;
  int iStack_22c;
  Allocator *local_218;
  Net scrfd;
  float norm_vals [3];
  float mean_vals [3];
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar10 = argv[1];
    std::__cxx11::string::string((string *)&scrfd,pcVar10,(allocator *)&image);
    cv::imread((string *)&m,(int)&scrfd);
    if ((Allocator **)scrfd._vptr_Net != &scrfd.opt.blob_allocator) {
      operator_delete(scrfd._vptr_Net);
    }
    cVar17 = cv::Mat::empty();
    if (cVar17 == '\0') {
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&scrfd);
      scrfd.opt.use_vulkan_compute = true;
      iVar18 = ncnn::Net::load_param(&scrfd,"scrfd_crowdhuman.param");
      if ((iVar18 != 0) ||
         (iVar18 = ncnn::Net::load_model(&scrfd,"scrfd_crowdhuman.bin"), iVar18 != 0)) {
        exit(-1);
      }
      iVar18 = (int)local_88;
      iVar20 = (int)((ulong)local_88 >> 0x20);
      if (iVar18 < iVar20) {
        fVar30 = 640.0 / (float)iVar20;
        iVar19 = (int)((float)iVar18 * fVar30);
        iVar28 = 0x280;
      }
      else {
        fVar30 = 640.0 / (float)iVar18;
        iVar28 = (int)((float)iVar20 * fVar30);
        iVar19 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,0x10002,iVar20,iVar18,iVar28,iVar19,(Allocator *)0x0);
      local_2b8.cstep = 0;
      local_2b8.data._0_1_ = false;
      local_2b8.data._1_1_ = false;
      local_2b8.data._2_1_ = false;
      local_2b8.data._3_1_ = false;
      local_2b8.data._4_1_ = false;
      local_2b8.data._5_1_ = false;
      local_2b8.data._6_1_ = false;
      local_2b8.data._7_1_ = false;
      local_2b8.refcount._0_4_ = 0;
      local_2b8.refcount._4_1_ = false;
      local_2b8.refcount._5_1_ = false;
      local_2b8.refcount._6_1_ = false;
      local_2b8.refcount._7_1_ = false;
      local_2b8.elemsize = 0;
      local_2b8.elempack = 0;
      local_2b8.allocator = (Allocator *)0x0;
      local_2b8.dims = 0;
      local_2b8.w = 0;
      local_2b8.h = 0;
      local_2b8.d = 0;
      local_2b8.c = 0;
      ncnn::Option::Option((Option *)&areas);
      iVar28 = ((iVar28 + 0x1f) / 0x20) * 0x20 - iVar28;
      iVar19 = ((iVar19 + 0x1f) / 0x20) * 0x20 - iVar19;
      left = iVar28 / 2;
      top = iVar19 / 2;
      ncnn::copy_make_border
                ((Mat *)&image,&local_2b8,top,iVar19 - top,left,iVar28 - left,0,0.0,(Option *)&areas
                );
      mean_vals[0] = 127.5;
      mean_vals[1] = 127.5;
      mean_vals[2] = 127.5;
      norm_vals[0] = 0.0078125;
      norm_vals[1] = 0.0078125;
      norm_vals[2] = 0.0078125;
      ncnn::Mat::substract_mean_normalize(&local_2b8,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"input.1",&local_2b8);
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.allocator = (Allocator *)0x0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      ncnn::Extractor::extract(&ex,"490",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"493",&local_498,0);
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_428 = (Allocator *)0x0;
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      ncnn::Mat::create((Mat *)local_448,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_448._4_4_,local_448._0_4_) = 0x40000000;
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = (Allocator *)0x0;
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      ncnn::Mat::create((Mat *)local_3d8,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,8,(Mat *)local_448,(Mat *)local_3d8);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,8,(Mat *)&areas,&local_498,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380 != (int *)0x0) {
        LOCK();
        *local_380 = *local_380 + -1;
        UNLOCK();
        if (*local_380 == 0) {
          if (local_368 == (Allocator *)0x0) {
            if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
              free((void *)CONCAT44(label_size.height,label_size.width));
            }
          }
          else {
            (*local_368->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_));
            }
          }
          else {
            (*local_3b8->_vptr_Allocator[3])();
          }
        }
      }
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      piVar13 = (int *)CONCAT44(local_448._12_4_,local_448._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_428 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448._4_4_,local_448._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448._4_4_,local_448._0_4_));
            }
          }
          else {
            (*local_428->_vptr_Allocator[3])();
          }
        }
      }
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      piVar13 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
            }
          }
          else {
            (*(local_498.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.allocator = (Allocator *)0x0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      ncnn::Extractor::extract(&ex,"510",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"513",&local_498,0);
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_428 = (Allocator *)0x0;
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      ncnn::Mat::create((Mat *)local_448,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_448._4_4_,local_448._0_4_) = 0x40000000;
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = (Allocator *)0x0;
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      ncnn::Mat::create((Mat *)local_3d8,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x10,(Mat *)local_448,(Mat *)local_3d8);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x10,(Mat *)&areas,&local_498,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380 != (int *)0x0) {
        LOCK();
        *local_380 = *local_380 + -1;
        UNLOCK();
        if (*local_380 == 0) {
          if (local_368 == (Allocator *)0x0) {
            if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
              free((void *)CONCAT44(label_size.height,label_size.width));
            }
          }
          else {
            (*local_368->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_));
            }
          }
          else {
            (*local_3b8->_vptr_Allocator[3])();
          }
        }
      }
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      piVar13 = (int *)CONCAT44(local_448._12_4_,local_448._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_428 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448._4_4_,local_448._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448._4_4_,local_448._0_4_));
            }
          }
          else {
            (*local_428->_vptr_Allocator[3])();
          }
        }
      }
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      piVar13 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
            }
          }
          else {
            (*(local_498.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.allocator = (Allocator *)0x0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      ncnn::Extractor::extract(&ex,"530",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"533",&local_498,0);
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_428 = (Allocator *)0x0;
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      ncnn::Mat::create((Mat *)local_448,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_448._4_4_,local_448._0_4_) = 0x40000000;
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = (Allocator *)0x0;
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      ncnn::Mat::create((Mat *)local_3d8,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x20,(Mat *)local_448,(Mat *)local_3d8);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x20,(Mat *)&areas,&local_498,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380 != (int *)0x0) {
        LOCK();
        *local_380 = *local_380 + -1;
        UNLOCK();
        if (*local_380 == 0) {
          if (local_368 == (Allocator *)0x0) {
            if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
              free((void *)CONCAT44(label_size.height,label_size.width));
            }
          }
          else {
            (*local_368->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_));
            }
          }
          else {
            (*local_3b8->_vptr_Allocator[3])();
          }
        }
      }
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      piVar13 = (int *)CONCAT44(local_448._12_4_,local_448._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_428 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448._4_4_,local_448._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448._4_4_,local_448._0_4_));
            }
          }
          else {
            (*local_428->_vptr_Allocator[3])();
          }
        }
      }
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      piVar13 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
            }
          }
          else {
            (*(local_498.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.allocator = (Allocator *)0x0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      ncnn::Extractor::extract(&ex,"550",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"553",&local_498,0);
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_428 = (Allocator *)0x0;
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      ncnn::Mat::create((Mat *)local_448,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_448._4_4_,local_448._0_4_) = 0x40000000;
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = (Allocator *)0x0;
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      ncnn::Mat::create((Mat *)local_3d8,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x40,(Mat *)local_448,(Mat *)local_3d8);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x40,(Mat *)&areas,&local_498,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380 != (int *)0x0) {
        LOCK();
        *local_380 = *local_380 + -1;
        UNLOCK();
        if (*local_380 == 0) {
          if (local_368 == (Allocator *)0x0) {
            if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
              free((void *)CONCAT44(label_size.height,label_size.width));
            }
          }
          else {
            (*local_368->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_));
            }
          }
          else {
            (*local_3b8->_vptr_Allocator[3])();
          }
        }
      }
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      piVar13 = (int *)CONCAT44(local_448._12_4_,local_448._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_428 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448._4_4_,local_448._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448._4_4_,local_448._0_4_));
            }
          }
          else {
            (*local_428->_vptr_Allocator[3])();
          }
        }
      }
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      piVar13 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
            }
          }
          else {
            (*(local_498.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.allocator = (Allocator *)0x0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      ncnn::Extractor::extract(&ex,"570",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"573",&local_498,0);
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_428 = (Allocator *)0x0;
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      ncnn::Mat::create((Mat *)local_448,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_448._4_4_,local_448._0_4_) = 0x40000000;
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3b8 = (Allocator *)0x0;
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      ncnn::Mat::create((Mat *)local_3d8,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x80,(Mat *)local_448,(Mat *)local_3d8);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x80,(Mat *)&areas,&local_498,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380 != (int *)0x0) {
        LOCK();
        *local_380 = *local_380 + -1;
        UNLOCK();
        if (*local_380 == 0) {
          if (local_368 == (Allocator *)0x0) {
            if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
              free((void *)CONCAT44(label_size.height,label_size.width));
            }
          }
          else {
            (*local_368->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_3b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_));
            }
          }
          else {
            (*local_3b8->_vptr_Allocator[3])();
          }
        }
      }
      local_398 = 0;
      local_3d8._0_4_ = 0;
      local_3d8._4_4_ = 0;
      local_3d8._8_4_ = 0;
      local_3d8._12_4_ = 0;
      local_3d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_3b0 = 0;
      iStack_3ac = 0;
      uStack_3a8._0_4_ = 0;
      uStack_3a8._4_4_ = 0;
      local_3a0 = 0;
      piVar13 = (int *)CONCAT44(local_448._12_4_,local_448._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_428 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_448._4_4_,local_448._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_448._4_4_,local_448._0_4_));
            }
          }
          else {
            (*local_428->_vptr_Allocator[3])();
          }
        }
      }
      local_408 = 0;
      local_448._0_4_ = 0;
      local_448._4_4_ = 0;
      local_448._8_4_ = 0;
      local_448._12_4_ = 0;
      local_448._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_420 = 0;
      iStack_41c = 0;
      uStack_418._0_4_ = 0;
      uStack_418._4_4_ = 0;
      local_410 = 0;
      piVar13 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
            }
          }
          else {
            (*(local_498.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_498.cstep = 0;
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      local_498.refcount._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.elempack = 0;
      local_498.dims = 0;
      local_498.w = 0;
      local_498.h = 0;
      local_498.d = 0;
      local_498.c = 0;
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start !=
          faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&faceproposals,0,
                   (int)((ulong)((long)faceproposals.
                                       super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)faceproposals.
                                      super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333
                   + -1);
      }
      local_498.data._0_4_ = 0;
      local_498.data._4_4_ = 0;
      local_498.elemsize = 0;
      local_498.refcount._4_4_ = 0;
      local_498.refcount._0_4_ = 0;
      uVar27 = (int)((long)faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x33333333;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar27,(allocator_type *)local_448);
      if ((int)uVar27 < 1) {
        local_448._0_4_ = 0;
      }
      else {
        pfVar21 = &((faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                     _M_impl.super__Vector_impl_data._M_start)->rect).height;
        uVar25 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar25] = pfVar21[-1] * *pfVar21;
          uVar25 = uVar25 + 1;
          pfVar21 = pfVar21 + 5;
        } while ((uVar27 & 0x7fffffff) != uVar25);
        local_448._0_4_ = 0;
        do {
          uVar23 = (uint)((ulong)((long)local_498.refcount -
                                 CONCAT44(local_498.data._4_4_,local_498.data._0_4_)) >> 2);
          if ((int)uVar23 < 1) {
LAB_001628cd:
            if (local_498.refcount == (int *)local_498.elemsize) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_498,(iterator)local_498.refcount,
                         (int *)local_448);
            }
            else {
              *local_498.refcount = local_448._0_4_;
              local_498.refcount = local_498.refcount + 1;
            }
          }
          else {
            lVar26 = (long)(int)local_448._0_4_;
            uVar25._0_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar26].rect.x;
            uVar25._4_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar26].rect.y;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar25;
            uVar2 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar26].rect.width;
            uVar6 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar26].rect.height;
            auVar37._0_4_ = (float)uVar2 + (float)(undefined4)uVar25;
            auVar37._4_4_ = (float)uVar6 + (float)uVar25._4_4_;
            auVar37._8_8_ = 0;
            bVar14 = true;
            uVar25 = 0;
            do {
              iVar19 = *(int *)(CONCAT44(local_498.data._4_4_,local_498.data._0_4_) + uVar25 * 4);
              uVar29._0_4_ = faceproposals.
                             super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar19].rect.x;
              uVar29._4_4_ = faceproposals.
                             super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar19].rect.y;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar29;
              uVar3 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar19].rect.width;
              uVar7 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar19].rect.height;
              auVar35._0_4_ = (float)uVar3 + (float)(undefined4)uVar29;
              auVar35._4_4_ = (float)uVar7 + (float)uVar29._4_4_;
              auVar35._8_8_ = 0;
              auVar39 = maxps(auVar39,auVar32);
              auVar35 = minps(auVar35,auVar37);
              fVar33 = auVar35._0_4_ - auVar39._0_4_;
              fVar38 = auVar35._4_4_ - auVar39._4_4_;
              fVar34 = 0.0;
              if (0.0 < fVar38 && 0.0 < fVar33) {
                fVar34 = fVar33 * fVar38;
              }
              if (0.45 < fVar34 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar19] +
                                   areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar26]) - fVar34)) {
                bVar14 = false;
              }
              uVar25 = uVar25 + 1;
            } while ((uVar23 & 0x7fffffff) != uVar25);
            if (bVar14) goto LAB_001628cd;
          }
          local_448._0_4_ = local_448._0_4_ + 1;
        } while ((int)local_448._0_4_ < (int)uVar27);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar27 = (uint)((ulong)((long)local_498.refcount -
                             CONCAT44(local_498.data._4_4_,local_498.data._0_4_)) >> 2);
      std::vector<FaceObject,_std::allocator<FaceObject>_>::resize(&faceobjects,(long)(int)uVar27);
      if (0 < (int)uVar27) {
        uVar29 = CONCAT44((float)iVar18 + -1.0,(float)iVar20 + -1.0);
        uVar25 = 0;
        pFVar24 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar18 = *(int *)(CONCAT44(local_498.data._4_4_,local_498.data._0_4_) + uVar25 * 4);
          pFVar24->prob =
               faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
               super__Vector_impl_data._M_start[iVar18].prob;
          uVar4 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18].rect.x;
          uVar8 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18].rect.y;
          (pFVar24->rect).x = (float)uVar4;
          (pFVar24->rect).y = (float)uVar8;
          uVar5 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18].rect.width;
          uVar9 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18].rect.height;
          auVar31._0_4_ = (float)uVar4 - (float)left;
          auVar31._4_4_ = (float)uVar8 - (float)top;
          auVar31._8_8_ = 0;
          auVar11._4_4_ = fVar30;
          auVar11._0_4_ = fVar30;
          auVar11._8_4_ = fVar30;
          auVar11._12_4_ = fVar30;
          auVar32 = divps(auVar31,auVar11);
          auVar36._0_4_ = ((float)uVar5 + (float)uVar4) - (float)left;
          auVar36._4_4_ = ((float)uVar9 + (float)uVar8) - (float)top;
          auVar36._8_8_ = 0;
          auVar12._4_4_ = fVar30;
          auVar12._0_4_ = fVar30;
          auVar12._8_4_ = fVar30;
          auVar12._12_4_ = fVar30;
          auVar37 = divps(auVar36,auVar12);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar29;
          auVar32 = minps(auVar40,auVar32);
          auVar32 = maxps(ZEXT816(0),auVar32);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar29;
          auVar37 = minps(auVar41,auVar37);
          auVar37 = maxps(ZEXT816(0),auVar37);
          (pFVar24->rect).x = (float)(int)auVar32._0_8_;
          (pFVar24->rect).y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
          (pFVar24->rect).width = auVar37._0_4_ - auVar32._0_4_;
          (pFVar24->rect).height = auVar37._4_4_ - auVar32._4_4_;
          uVar25 = uVar25 + 1;
          pFVar24 = pFVar24 + 1;
        } while ((uVar27 & 0x7fffffff) != uVar25);
      }
      if ((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_498.data._4_4_,local_498.data._0_4_));
      }
      if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar13 = (int *)CONCAT44(local_2b8.refcount._4_4_,(int)local_2b8.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_));
            }
          }
          else {
            (*(local_2b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2b8.cstep = 0;
      local_2b8.data._0_1_ = false;
      local_2b8.data._1_1_ = false;
      local_2b8.data._2_1_ = false;
      local_2b8.data._3_1_ = false;
      local_2b8.data._4_1_ = false;
      local_2b8.data._5_1_ = false;
      local_2b8.data._6_1_ = false;
      local_2b8.data._7_1_ = false;
      local_2b8.refcount._0_4_ = 0;
      local_2b8.refcount._4_1_ = false;
      local_2b8.refcount._5_1_ = false;
      local_2b8.refcount._6_1_ = false;
      local_2b8.refcount._7_1_ = false;
      local_2b8.elemsize = 0;
      local_2b8.elempack = 0;
      local_2b8.dims = 0;
      local_2b8.w = 0;
      local_2b8.h = 0;
      local_2b8.d = 0;
      local_2b8.c = 0;
      piVar13 = (int *)CONCAT44(iStack_22c,local_230);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_218 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_218->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&scrfd);
      cv::Mat::clone();
      psVar16 = (size_t *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_);
      if (faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar26 = 0;
        uVar25 = 0;
        pFVar24 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_2b8.data = psVar16;
          fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pFVar24->prob + lVar26),
                  (double)*(float *)((long)&(pFVar24->rect).x + lVar26),
                  (double)*(float *)((long)&(pFVar24->rect).y + lVar26),
                  (double)*(float *)((long)&(pFVar24->rect).width + lVar26),
                  (double)*(float *)((long)&(pFVar24->rect).height + lVar26));
          local_2b8.elemsize = 0;
          local_2b8.data._0_1_ = false;
          local_2b8.data._1_1_ = false;
          local_2b8.data._2_1_ = true;
          local_2b8.data._3_1_ = true;
          local_448._0_4_ = (undefined4)ROUND(*(float *)((long)&(pFVar24->rect).x + lVar26));
          local_448._4_4_ = (undefined4)ROUND(*(float *)((long)&(pFVar24->rect).y + lVar26));
          local_448._8_4_ = (undefined4)ROUND(*(float *)((long)&(pFVar24->rect).width + lVar26));
          local_448._12_4_ = (undefined4)ROUND(*(float *)((long)&(pFVar24->rect).height + lVar26));
          scrfd._vptr_Net = (_func_int **)0x0;
          scrfd.opt.lightmode = false;
          scrfd.opt._1_3_ = 0;
          scrfd.opt.num_threads = 0x406fe000;
          scrfd.opt.blob_allocator = (Allocator *)0x0;
          scrfd.opt.workspace_allocator = (Allocator *)0x0;
          local_2b8.refcount = (int *)&image;
          cv::rectangle(&local_2b8,local_448,&scrfd,1,8,0);
          sprintf((char *)&scrfd,"%.1f%%",
                  (double)(*(float *)((long)&pFVar24->prob + lVar26) * 100.0));
          auVar15._12_4_ = 0;
          auVar15._0_12_ =
               (undefined1  [12])
               faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
               super__Vector_impl_data._4_12_;
          faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar15 << 0x20;
          local_2b8.data = &local_2b8.elemsize;
          sVar22 = strlen((char *)&scrfd);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,&scrfd,(long)&scrfd._vptr_Net + sVar22);
          cv::getTextSize((string *)&label_size,(int)&local_2b8,0.5,0,(int *)0x1);
          if ((size_t *)local_2b8.data != &local_2b8.elemsize) {
            operator_delete(local_2b8.data);
          }
          iVar20 = (int)*(float *)((long)&(pFVar24->rect).x + lVar26);
          iVar18 = (int)((*(float *)((long)&(pFVar24->rect).y + lVar26) - (float)label_size.height)
                        - (float)(int)faceobjects32.
                                      super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          iVar19 = iStack_22c - label_size.width;
          if (label_size.width + iVar20 <= iStack_22c) {
            iVar19 = iVar20;
          }
          local_498.elemsize = 0;
          local_498.data._0_4_ = 0x3010000;
          local_3d8._12_4_ =
               (int)faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start + label_size.height;
          local_3d8._8_4_ = label_size.width;
          local_2b8.data._0_1_ = false;
          local_2b8.data._1_1_ = false;
          local_2b8.data._2_1_ = false;
          local_2b8.data._3_1_ = false;
          local_2b8.data._4_1_ = false;
          local_2b8.data._5_1_ = true;
          local_2b8.data._6_1_ = true;
          local_2b8.data._7_1_ = true;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_1_ = false;
          local_2b8.refcount._5_1_ = true;
          local_2b8.refcount._6_1_ = true;
          local_2b8.refcount._7_1_ = true;
          local_2b8.elemsize = 0x406fe00000000000;
          local_2b8.elempack = 0;
          local_2b8._28_4_ = 0;
          local_3d8._0_4_ = iVar19;
          local_3d8._4_4_ = iVar18;
          local_498.refcount = (int *)&image;
          cv::rectangle(&local_498,local_3d8,&local_2b8,0xffffffff,8,0);
          local_498.elemsize = 0;
          local_498.data._0_4_ = 0x3010000;
          local_2b8.data = &local_2b8.elemsize;
          local_498.refcount = (int *)&image;
          sVar22 = strlen((char *)&scrfd);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,&scrfd,(long)&scrfd._vptr_Net + sVar22);
          faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = iVar18 + label_size.height;
          faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = iVar19;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,&local_498,&local_2b8,&faceproposals,0,&areas,1,8,0);
          psVar16 = (size_t *)local_2b8.data;
          if ((size_t *)local_2b8.data != &local_2b8.elemsize) {
            operator_delete(local_2b8.data);
            psVar16 = (size_t *)local_2b8.data;
          }
          local_2b8.data._4_4_ = (undefined4)((ulong)psVar16 >> 0x20);
          uVar25 = uVar25 + 1;
          lVar26 = lVar26 + 0x14;
          pFVar24 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)(((long)faceobjects.
                                         super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)faceobjects.
                                         super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x3333333333333333));
      }
      local_2b8.refcount = (int *)&image;
      ppAVar1 = &scrfd.opt.blob_allocator;
      scrfd.opt.blob_allocator = (Allocator *)CONCAT26(scrfd.opt.blob_allocator._6_2_,0x6567616d69);
      scrfd.opt.lightmode = true;
      scrfd.opt._1_3_ = 0;
      scrfd.opt.num_threads = 0;
      local_2b8.elemsize = 0;
      local_2b8.data._0_1_ = false;
      local_2b8.data._1_1_ = false;
      local_2b8.data._2_1_ = true;
      local_2b8.data._3_1_ = true;
      scrfd._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&scrfd,(_InputArray *)&local_2b8);
      if ((Allocator **)scrfd._vptr_Net != ppAVar1) {
        operator_delete(scrfd._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar18 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar10);
      iVar18 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar18 = -1;
  }
  return iVar18;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_scrfd(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}